

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quick_connection.cc
# Opt level: O0

void __thiscall
QuickConnection::OnMessage
          (QuickConnection *this,string *ip,uint16_t port,uint8_t *data,int16_t data_len)

{
  uint16_t packet_number;
  ushort uVar1;
  uint32_t session_id;
  AckThread *this_00;
  bool bVar2;
  int iVar3;
  pointer pQVar4;
  undefined4 extraout_var;
  uint64_t uVar5;
  undefined4 extraout_var_00;
  pointer pRVar6;
  ReceivedPacket *this_01;
  QuicTime local_e8;
  undefined1 local_e0 [8];
  PacketInfo info;
  uint64_t timestamp;
  undefined4 local_b4;
  Location local_b0;
  uint16_t local_92;
  pointer puStack_90;
  int16_t payload_len;
  QuickPayload *msg;
  unique_ptr<unsigned_char,_std::default_delete<unsigned_char>_> packet;
  type local_70;
  int16_t local_2a;
  uint8_t *puStack_28;
  int16_t data_len_local;
  uint8_t *data_local;
  string *psStack_18;
  uint16_t port_local;
  string *ip_local;
  QuickConnection *this_local;
  
  local_2a = data_len;
  puStack_28 = data;
  data_local._6_2_ = port;
  psStack_18 = ip;
  ip_local = (string *)this;
  bVar2 = dd::TaskQueueBase::IsCurrent(&this->_thread->super_TaskQueueBase);
  if (bVar2) {
    std::unique_ptr<unsigned_char,std::default_delete<unsigned_char>>::
    unique_ptr<std::default_delete<unsigned_char>,void>
              ((unique_ptr<unsigned_char,std::default_delete<unsigned_char>> *)&msg,puStack_28);
    puStack_90 = puStack_28;
    local_92 = local_2a - 0x11;
    if ((short)local_92 < 1) {
      dd::Location::Location
                (&local_b0,"OnMessage",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/boss-li[P]quick/quick/quick_connection.cc"
                 ,0x51);
      LogWrapper::Write(&g_quic_log,&local_b0,2,"process payload failed, payload_len = %d",
                        (ulong)(uint)(int)(short)local_92);
      local_b4 = 1;
    }
    else {
      pQVar4 = std::unique_ptr<quic::QuicClock,_std::default_delete<quic::QuicClock>_>::operator->
                         (&this->_clock);
      iVar3 = (*pQVar4->_vptr_QuicClock[3])();
      timestamp = CONCAT44(extraout_var,iVar3);
      uVar5 = quic::QuicTime::ToDebuggingValue((QuicTime *)&timestamp);
      this->_latest_recv_msg_time = uVar5;
      if (*(ulong *)(puStack_90 + 9) < this->_latest_received_timestamp) {
        local_b4 = 1;
      }
      else {
        this->_latest_received_timestamp = *(uint64_t *)(puStack_90 + 9);
        info._16_8_ = *(undefined8 *)(puStack_90 + 0x11);
        PacketInfo::PacketInfo
                  ((PacketInfo *)local_e0,*(uint16_t *)(puStack_90 + 7),local_92,info._16_8_,
                   this->_expect_recv_sequence_number,*(uint16_t *)(puStack_90 + 5));
        this_00 = this->_ack_thread;
        session_id = this->_session_id;
        packet_number = *(uint16_t *)(puStack_90 + 5);
        pQVar4 = std::unique_ptr<quic::QuicClock,_std::default_delete<quic::QuicClock>_>::operator->
                           (&this->_clock);
        iVar3 = (*pQVar4->_vptr_QuicClock[3])();
        local_e8.time_ = CONCAT44(extraout_var_00,iVar3);
        uVar5 = quic::QuicTime::ToDebuggingValue(&local_e8);
        AckThread::Append(this_00,session_id,packet_number,uVar5);
        bVar2 = quic::IsNewer<unsigned_short>
                          (*(unsigned_short *)(puStack_90 + 7),this->_expect_recv_sequence_number);
        if ((bVar2) || (*(uint16_t *)(puStack_90 + 7) == this->_expect_recv_sequence_number)) {
          pRVar6 = std::unique_ptr<ReceivedPacket,_std::default_delete<ReceivedPacket>_>::get
                             (this->_received_packets + *(ushort *)(puStack_90 + 7));
          if ((pRVar6 != (pointer)0x0) &&
             (pRVar6 = std::unique_ptr<ReceivedPacket,_std::default_delete<ReceivedPacket>_>::get
                                 (this->_received_packets + *(ushort *)(puStack_90 + 7)),
             (uint)pRVar6->data_len != (int)(short)local_92)) {
            __assert_fail("_received_packets[msg->sequence_number].get()->data_len == payload_len",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/boss-li[P]quick/quick/quick_connection.cc"
                          ,0x72,
                          "void QuickConnection::OnMessage(const std::string &, uint16_t, const uint8_t *, int16_t)"
                         );
          }
          uVar1 = *(ushort *)(puStack_90 + 7);
          this_01 = (ReceivedPacket *)operator_new(0x10);
          ReceivedPacket::ReceivedPacket
                    (this_01,*(uint16_t *)(puStack_90 + 7),puStack_90 + 0x11,local_92);
          std::unique_ptr<ReceivedPacket,_std::default_delete<ReceivedPacket>_>::reset
                    (this->_received_packets + uVar1,this_01);
        }
        DeliverReceivedPackets(this,*(uint16_t *)(puStack_90 + 7));
        local_b4 = 0;
      }
    }
    std::unique_ptr<unsigned_char,_std::default_delete<unsigned_char>_>::~unique_ptr
              ((unique_ptr<unsigned_char,_std::default_delete<unsigned_char>_> *)&msg);
  }
  else {
    local_70.this = this;
    std::__cxx11::string::string((string *)&local_70.ip,(string *)psStack_18);
    local_70.port = data_local._6_2_;
    local_70.data = puStack_28;
    local_70.data_len = local_2a;
    PostTask<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_boss_li[P]quick_quick_quick_connection_cc:71:12),_nullptr>
              (this,&local_70);
    OnMessage(std::__cxx11::string_const&,unsigned_short,unsigned_char_const*,short)::$_0::~__0
              ((__0 *)&local_70);
  }
  return;
}

Assistant:

void QuickConnection::OnMessage(const std::string &ip, uint16_t port, const uint8_t* data, int16_t data_len)
{
	if (!_thread->IsCurrent()) {
		PostTask([this, ip, port, data, data_len] {
			OnMessage(ip, port, data, data_len);
		});
		return;
	}
	std::unique_ptr<uint8_t> packet(const_cast<uint8_t*>(data));

	QuickPayload *msg = (QuickPayload*)data;
	int16_t payload_len = data_len - sizeof(QuickPayload) + 1;
	if (payload_len <= 0) {
		g_quic_log.Write(RTC_FROM_HERE, LOG_LEVEL_INFO, "process payload failed, payload_len = %d", payload_len);
		return;
	}

	_latest_recv_msg_time = _clock->Now().ToDebuggingValue();

	// udp�������������£������� send_timestamp��_latest_received_timestampС�����������������İ�ֱ�ӽ��ж�������ack����Ҫ�ظ���
	// ���Ͷ��ڷ���ʱ��send_timestamp���ϸ񵥵������ģ������İ��ɷ��Ͱ������ش����ɡ�
	// һ�������£�ֻ������·�ɷ����仯�������£�udp���ſ��ܻ������������������������������������������շ�����ʱ��
	// ���������������޵�����Ҳ���п��ܳ���������
	if (msg->send_timestamp < _latest_received_timestamp)
		return;
	_latest_received_timestamp = msg->send_timestamp;

#ifdef OUTPUT_VERBOSE_INFO
	dd::OutputDebugInfo("recv packet, packet number = %u, sequence number = %u, len = %d, now = %llu\r\n", msg->packet_number, msg->sequence_number,
			payload_len, _clock->Now().ToDebuggingValue());
#endif

	uint64_t timestamp = 0;
	memcpy(&timestamp, msg->payload, sizeof(&time));
	PacketInfo info(msg->sequence_number, payload_len, timestamp, _expect_recv_sequence_number, msg->packet_number);
	//_real_recv_packets_len[timestamp] = info;
#ifdef OUTPUT_DEBUG_INFO
		_real_recv_packets_len.push_back(info);
#endif

	_ack_thread->Append(_session_id, msg->packet_number, _clock->Now().ToDebuggingValue());

	// ֻ�бȵ�ǰ�������յ����Ÿ��µİ��ŷ��뵽���塣
	// �ش��������£�sequence_number���ܻ��� _expect_recv_sequence_number����
	if (quic::IsNewer(msg->sequence_number, _expect_recv_sequence_number) || msg->sequence_number == _expect_recv_sequence_number) {
		if(_received_packets[msg->sequence_number].get())
			assert(_received_packets[msg->sequence_number].get()->data_len == payload_len);
		_received_packets[msg->sequence_number].reset(new ReceivedPacket(msg->sequence_number, msg->payload, payload_len));

	}

	DeliverReceivedPackets(msg->sequence_number);
}